

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O2

int menu_bar_sub_win_top_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  int iVar4;
  Am_Object menu_bar;
  Am_Object for_item;
  int y;
  Am_Widget_Look look;
  int x;
  
  pAVar3 = Am_Object::Get(self,0x1d3,0);
  Am_Object::Am_Object(&for_item,pAVar3);
  Am_Object::Get_Owner(&menu_bar,(Am_Slot_Flags)&for_item);
  pAVar3 = Am_Object::Get(&menu_bar,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&look,pAVar3);
  pAVar3 = Am_Object::Get(&menu_bar,0x67,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  if (look.value < (Am_MACINTOSH_LOOK_val|Am_WINDOWS_LOOK_val)) {
    bVar1 = Am_Object::Valid(&for_item);
    iVar4 = 0;
    if (bVar1) {
      bVar1 = Am_Object::Valid(&menu_bar);
      iVar4 = 0;
      if (bVar1) {
        x = 0;
        y = 0;
        Am_Translate_Coordinates(&menu_bar,0,look.value * 2 + -5 + iVar2,&Am_Screen,&x,&y);
        iVar4 = y;
      }
    }
    Am_Object::~Am_Object(&menu_bar);
    Am_Object::~Am_Object(&for_item);
    return iVar4;
  }
  Am_Error("Unknown Look parameter");
}

Assistant:

Am_Define_Formula(int, menu_bar_sub_win_top)
{
  Am_Object for_item = self.Get(Am_FOR_ITEM);
  Am_Object menu_bar = for_item.Get_Owner();
  Am_Widget_Look look = menu_bar.Get(Am_WIDGET_LOOK);
  int height = menu_bar.Get(Am_HEIGHT);

  int overlap = 0;
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    overlap = 5;
    break;

  case Am_WINDOWS_LOOK_val:
    overlap = 3;
    break;

  case Am_MACINTOSH_LOOK_val:
    overlap = 1;
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }

  if (for_item.Valid() && menu_bar.Valid()) {
    int x = 0; //initializations so no compiler warnings for translate_coords
    int y = 0;
    // get the coordinates of the bottom of the menu item w.r.t. the screen
    Am_Translate_Coordinates(menu_bar, 0, height - overlap, Am_Screen, x, y);
    return y;
  } else
    return 0;
}